

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi_Buffer.cpp
# Opt level: O2

void __thiscall Stereo_Buffer::Stereo_Buffer(Stereo_Buffer *this)

{
  long lVar1;
  
  (this->super_Multi_Buffer).length_ = 0;
  (this->super_Multi_Buffer).samples_per_frame_ = 2;
  (this->super_Multi_Buffer).sample_rate_ = 0;
  (this->super_Multi_Buffer).channels_changed_count_ = 1;
  (this->super_Multi_Buffer)._vptr_Multi_Buffer = (_func_int **)&PTR__Stereo_Buffer_0070cab8;
  lVar1 = 0;
  do {
    Blip_Buffer::Blip_Buffer((Blip_Buffer *)(&this->field_0x20 + lVar1));
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0xc0);
  (this->chan).center = (Blip_Buffer *)&this->field_0x20;
  (this->chan).left = (Blip_Buffer *)&this->field_0x60;
  (this->chan).right = (Blip_Buffer *)&this->field_0xa0;
  return;
}

Assistant:

Stereo_Buffer::Stereo_Buffer() : Multi_Buffer( 2 )
{
	chan.center = &bufs [0];
	chan.left = &bufs [1];
	chan.right = &bufs [2];
}